

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap.h
# Opt level: O1

void __thiscall
Gluco::Heap<Gluco::Solver::VarOrderLt>::decrease(Heap<Gluco::Solver::VarOrderLt> *this,int n)

{
  if ((n < (this->indices).sz) && (-1 < (this->indices).data[n])) {
    percolateUp(this,(this->indices).data[n]);
    return;
  }
  __assert_fail("inHeap(n)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/glucose/Heap.h"
                ,0x56,
                "void Gluco::Heap<Gluco::Solver::VarOrderLt>::decrease(int) [Comp = Gluco::Solver::VarOrderLt]"
               );
}

Assistant:

bool inHeap    (int n)     const { return n < indices.size() && indices[n] >= 0; }